

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

void flag_message(wchar_t flag,char *name)

{
  int iVar1;
  obj_property *poVar2;
  ushort **ppuVar3;
  bool bVar4;
  size_t local_450;
  size_t end;
  char *in_cursor;
  char *tag;
  char *s;
  char *next;
  char buf [1024];
  obj_property *prop;
  char *name_local;
  wchar_t flag_local;
  
  poVar2 = lookup_obj_property(L'\x03',flag);
  memset(&next,0,0x400);
  local_450 = 0;
  if (poVar2->msg != (char *)0x0) {
    end = (size_t)poVar2->msg;
    s = strchr((char *)end,0x7b);
    while (s != (char *)0x0) {
      strnfcat((char *)&next,0x400,&local_450,"%.*s",(ulong)(uint)((int)s - (int)end),end);
      tag = s;
      do {
        tag = tag + 1;
        bVar4 = false;
        if (*tag != '\0') {
          ppuVar3 = __ctype_b_loc();
          bVar4 = ((*ppuVar3)[(int)(uint)(byte)*tag] & 0x400) != 0;
        }
      } while (bVar4);
      if (*tag == '}') {
        in_cursor = s + 1;
        end = (size_t)(tag + 1);
        iVar1 = strncmp(in_cursor,"name",4);
        if (iVar1 == 0) {
          strnfcat((char *)&next,0x400,&local_450,"%s",name);
        }
      }
      else {
        end = (size_t)(s + 1);
      }
      s = strchr((char *)end,0x7b);
    }
    strnfcat((char *)&next,0x400,&local_450,"%s",end);
    msg("%s",&next);
  }
  return;
}

Assistant:

void flag_message(int flag, char *name)
{
	struct obj_property *prop = lookup_obj_property(OBJ_PROPERTY_FLAG, flag);
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;

	/* See if we have a message */
	if (!prop->msg) return;
	in_cursor = prop->msg;

	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;
			if (strncmp(tag, "name", 4) == 0) {
				strnfcat(buf, 1024, &end, "%s", name); 
			}

		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msg("%s", buf);
}